

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O1

Allocation * __thiscall
density::detail::
LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::external_allocate<(density::detail::LfQueue_ProgressGuarantee)0>
          (Allocation *__return_storage_ptr__,
          LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          *this,uintptr_t i_control_bits,size_t i_size,size_t i_alignment)

{
  atomic<unsigned_long> *paVar1;
  void *i_block;
  Allocation inplace_put;
  Allocation local_48;
  
  LOCK();
  paVar1 = &(this->super_UnmovableFastTestAllocator<256UL>).m_living_allocations;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar1 = &(this->super_UnmovableFastTestAllocator<256UL>).m_living_bytes;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + i_size;
  UNLOCK();
  LOCK();
  paVar1 = &(this->super_UnmovableFastTestAllocator<256UL>).m_total_allocations;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  i_block = basic_default_allocator<256UL>::allocate
                      ((basic_default_allocator<256UL> *)this,i_size,i_alignment,0);
  LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
            (&local_48,
             (LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
              *)this,i_control_bits | 4,true,0x18,8);
  if ((undefined8 *)local_48.m_user_storage == (undefined8 *)0x0) {
    density_tests::UnmovableFastTestAllocator<256UL>::deallocate
              (&this->super_UnmovableFastTestAllocator<256UL>,i_block,i_size,i_alignment,0);
    i_block = (void *)0x0;
  }
  else {
    *(void **)local_48.m_user_storage = i_block;
    *(size_t *)((long)local_48.m_user_storage + 8) = i_size;
    *(size_t *)((long)local_48.m_user_storage + 0x10) = i_alignment;
    __return_storage_ptr__->m_control_block = local_48.m_control_block;
    __return_storage_ptr__->m_next_ptr = local_48.m_next_ptr;
  }
  __return_storage_ptr__->m_user_storage = i_block;
  return __return_storage_ptr__;
}

Assistant:

DENSITY_NO_INLINE Allocation external_allocate(
              uintptr_t i_control_bits,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee = PROGRESS_GUARANTEE; // used to avoid warnings about
                                                     // constant conditional expressions
                DENSITY_ASSUME(guarantee == LfQueue_Throwing || guarantee == LfQueue_Blocking);

                void * external_block;
                if (guarantee == LfQueue_Throwing)
                {
                    external_block = ALLOCATOR_TYPE::allocate(i_size, i_alignment);
                }
                else
                {
                    external_block = ALLOCATOR_TYPE::try_allocate(i_size, i_alignment);
                    if (external_block == nullptr)
                    {
                        return Allocation{};
                    }
                }

                try
                {
                    /* external blocks always allocate space for the type, because it would be
                        complicated for the consumers to handle both cases */
                    auto const inplace_put =
                      static_cast<DERIVED *>(this)
                        ->template try_inplace_allocate_impl<PROGRESS_GUARANTEE>(
                          i_control_bits | LfQueue_External,
                          true,
                          sizeof(ExternalBlock),
                          alignof(ExternalBlock));
                    if (inplace_put.m_user_storage == nullptr)
                    {
                        ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                        return Allocation{};
                    }
                    new (inplace_put.m_user_storage)
                      ExternalBlock{external_block, i_size, i_alignment};
                    return Allocation{
                      inplace_put.m_control_block, inplace_put.m_next_ptr, external_block};
                }
                catch (...)
                {
                    /* if inplace_allocate fails, that means that we were able to allocate the
                        external block, but we were not able to put the struct ExternalBlock in
                        the page (because a new page was necessary, but we could not allocate
                        it). */
                    ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT;
                }
            }